

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

string * cmake::FindCacheFile(string *__return_storage_ptr__,string *binaryDir)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  char *in_R8;
  string local_b0;
  undefined1 local_90 [8];
  string cachePathFound;
  string cmakeFiles;
  string cacheFile;
  string *binaryDir_local;
  string *cachePath;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)binaryDir);
  cmsys::SystemTools::ConvertToUnixSlashes(__return_storage_ptr__);
  std::__cxx11::string::string
            ((string *)(cmakeFiles.field_2._M_local_buf + 8),(string *)__return_storage_ptr__);
  std::__cxx11::string::operator+=
            ((string *)(cmakeFiles.field_2._M_local_buf + 8),"/CMakeCache.txt");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(pcVar2);
  if (!bVar1) {
    std::__cxx11::string::string
              ((string *)(cachePathFound.field_2._M_local_buf + 8),(string *)__return_storage_ptr__)
    ;
    std::__cxx11::string::operator+=
              ((string *)(cachePathFound.field_2._M_local_buf + 8),"/CMakeFiles");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileExists(pcVar2);
    if (bVar1) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::FileExistsInParentDirectories_abi_cxx11_
                ((string *)local_90,(cmSystemTools *)0xbc19cf,pcVar2,"/",in_R8);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        cmsys::SystemTools::GetFilenamePath(&local_b0,(string *)local_90);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      std::__cxx11::string::~string((string *)local_90);
    }
    std::__cxx11::string::~string((string *)(cachePathFound.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::~string((string *)(cmakeFiles.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string cmake::FindCacheFile(const std::string& binaryDir)
{
  std::string cachePath = binaryDir;
  cmSystemTools::ConvertToUnixSlashes(cachePath);
  std::string cacheFile = cachePath;
  cacheFile += "/CMakeCache.txt";
  if (!cmSystemTools::FileExists(cacheFile.c_str())) {
    // search in parent directories for cache
    std::string cmakeFiles = cachePath;
    cmakeFiles += "/CMakeFiles";
    if (cmSystemTools::FileExists(cmakeFiles.c_str())) {
      std::string cachePathFound =
        cmSystemTools::FileExistsInParentDirectories("CMakeCache.txt",
                                                     cachePath.c_str(), "/");
      if (!cachePathFound.empty()) {
        cachePath = cmSystemTools::GetFilenamePath(cachePathFound);
      }
    }
  }
  return cachePath;
}